

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O1

void __thiscall
httplib::detail::MultipartFormDataParser::MultipartFormDataParser(MultipartFormDataParser *this)

{
  (this->dash_)._M_dataplus._M_p = (pointer)&(this->dash_).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)this,"--","");
  (this->crlf_)._M_dataplus._M_p = (pointer)&(this->crlf_).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->crlf_,"\r\n","");
  (this->dash_crlf_)._M_dataplus._M_p = (pointer)&(this->dash_crlf_).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->dash_crlf_,"--\r\n","");
  (this->boundary_)._M_dataplus._M_p = (pointer)&(this->boundary_).field_2;
  (this->boundary_)._M_string_length = 0;
  (this->boundary_).field_2._M_local_buf[0] = '\0';
  (this->dash_boundary_crlf_)._M_dataplus._M_p = (pointer)&(this->dash_boundary_crlf_).field_2;
  (this->dash_boundary_crlf_)._M_string_length = 0;
  (this->dash_boundary_crlf_).field_2._M_local_buf[0] = '\0';
  (this->crlf_dash_boundary_)._M_dataplus._M_p = (pointer)&(this->crlf_dash_boundary_).field_2;
  (this->crlf_dash_boundary_)._M_string_length = 0;
  (this->crlf_dash_boundary_).field_2._M_local_buf[0] = '\0';
  this->state_ = 0;
  this->is_valid_ = false;
  (this->file_).name._M_dataplus._M_p = (pointer)&(this->file_).name.field_2;
  (this->file_).name._M_string_length = 0;
  (this->file_).name.field_2._M_local_buf[0] = '\0';
  (this->file_).content._M_dataplus._M_p = (pointer)&(this->file_).content.field_2;
  (this->file_).content._M_string_length = 0;
  (this->file_).content.field_2._M_local_buf[0] = '\0';
  (this->file_).filename._M_dataplus._M_p = (pointer)&(this->file_).filename.field_2;
  (this->file_).filename._M_string_length = 0;
  (this->file_).filename.field_2._M_local_buf[0] = '\0';
  (this->file_).content_type._M_dataplus._M_p = (pointer)&(this->file_).content_type.field_2;
  (this->file_).content_type._M_string_length = 0;
  (this->file_).content_type.field_2._M_local_buf[0] = '\0';
  (this->buf_)._M_dataplus._M_p = (pointer)&(this->buf_).field_2;
  (this->buf_)._M_string_length = 0;
  (this->buf_).field_2._M_local_buf[0] = '\0';
  this->buf_spos_ = 0;
  this->buf_epos_ = 0;
  return;
}

Assistant:

MultipartFormDataParser() = default;